

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_find_case(bson_iter_t *iter,char *key)

{
  _Bool _Var1;
  int iVar2;
  char *s2;
  char *key_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x14d,"bson_iter_find_case","iter");
    abort();
  }
  if (key != (char *)0x0) {
    do {
      _Var1 = bson_iter_next(iter);
      if (!_Var1) {
        return false;
      }
      s2 = bson_iter_key(iter);
      iVar2 = bson_strcasecmp(key,s2);
    } while (iVar2 != 0);
    return true;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x14e,"bson_iter_find_case","key");
  abort();
}

Assistant:

bool
bson_iter_find_case (bson_iter_t *iter, /* INOUT */
                     const char *key)   /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (key);

   while (bson_iter_next (iter)) {
      if (!bson_strcasecmp (key, bson_iter_key (iter))) {
         return true;
      }
   }

   return false;
}